

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMULSM9DS1.cpp
# Opt level: O2

bool __thiscall RTIMULSM9DS1::setGyroCTRL3(RTIMULSM9DS1 *this)

{
  uint uVar1;
  RTIMUSettings *this_00;
  bool bVar2;
  
  this_00 = (this->super_RTIMU).m_settings;
  uVar1 = this_00->m_LSM9DS1GyroHpf;
  if (uVar1 < 10) {
    bVar2 = RTIMUHal::HALWrite(&this_00->super_RTIMUHal,this->m_accelGyroSlaveAddr,'\x12',
                               (byte)uVar1 | 0x40,"Failed to set LSM9DS1 gyro CTRL3");
    return bVar2;
  }
  fprintf(_stderr,"Illegal LSM9DS1 gyro high pass filter code %d\n");
  return false;
}

Assistant:

bool RTIMULSM9DS1::setGyroCTRL3()
{
    unsigned char ctrl3;

    if ((m_settings->m_LSM9DS1GyroHpf < LSM9DS1_GYRO_HPF_0) || (m_settings->m_LSM9DS1GyroHpf > LSM9DS1_GYRO_HPF_9)) {
        HAL_ERROR1("Illegal LSM9DS1 gyro high pass filter code %d\n", m_settings->m_LSM9DS1GyroHpf);
        return false;
    }
    ctrl3 = m_settings->m_LSM9DS1GyroHpf;

    //  Turn on hpf
    ctrl3 |= 0x40;

    return m_settings->HALWrite(m_accelGyroSlaveAddr,  LSM9DS1_CTRL3, ctrl3, "Failed to set LSM9DS1 gyro CTRL3");
}